

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmInvMont(word *b,word *a,qr_o *r,void *stack)

{
  long in_RDX;
  size_t in_RDI;
  size_t k;
  void *in_stack_00000030;
  size_t in_stack_00000038;
  word *in_stack_00000040;
  word *in_stack_00000048;
  word *in_stack_00000050;
  undefined8 local_28;
  
  for (local_28 = zzAlmostInvMod(in_stack_00000050,in_stack_00000048,in_stack_00000040,
                                 in_stack_00000038,in_stack_00000030);
      local_28 < (ulong)(*(long *)(in_RDX + 0x30) << 7); local_28 = local_28 + 1) {
    zzDoubleMod((word *)r,(word *)stack,(word *)k,in_RDI);
  }
  return;
}

Assistant:

static void zmInvMont(word b[], const word a[], const qr_o* r, void* stack)
{
	register size_t k;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	// b <- a^{-1} 2^k \mod mod
	k = zzAlmostInvMod(b, a, r->mod, r->n, stack);
	ASSERT(wwBitSize(r->mod, r->n) <= k);
	ASSERT(k <= 2 * wwBitSize(r->mod, r->n));
	// b <- a^{-1} R^2 \mod mod
	for (; k < 2 * r->n * B_PER_W; ++k)
		zzDoubleMod(b, b, r->mod, r->n);
}